

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int Cudd_NextCube(DdGen *gen,int **cube,double *value)

{
  DdManager *pDVar1;
  DdNode **ppDVar2;
  int *piVar3;
  int iVar4;
  DdNode *pDVar5;
  uint uVar6;
  ulong uVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  
  iVar4 = (gen->stack).sp;
  if (iVar4 != 1) {
    pDVar1 = gen->manager;
    ppDVar2 = (gen->stack).stack;
    do {
      pDVar8 = (DdNode *)((ulong)ppDVar2[(long)iVar4 + -2] & 0xfffffffffffffffe);
      pDVar5 = (pDVar8->type).kids.T;
      pDVar9 = (DdNode *)((ulong)pDVar5 ^ 1);
      if (ppDVar2[(long)iVar4 + -2] == pDVar8) {
        pDVar9 = pDVar5;
      }
      piVar3 = (gen->gen).cubes.cube;
      if (pDVar9 != ppDVar2[(long)iVar4 + -1]) {
        piVar3[pDVar8->index] = 1;
        uVar7 = (ulong)(gen->stack).sp;
        ppDVar2[uVar7 - 1] = pDVar9;
        do {
          while( true ) {
            ppDVar2 = (gen->stack).stack;
            pDVar5 = ppDVar2[(long)(int)uVar7 + -1];
            pDVar9 = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
            if ((ulong)pDVar9->index == 0x7fffffff) break;
            (gen->gen).cubes.cube[pDVar9->index] = 0;
            pDVar8 = (pDVar9->type).kids.E;
            pDVar10 = (DdNode *)((ulong)pDVar8 ^ 1);
            if (pDVar5 == pDVar9) {
              pDVar10 = pDVar8;
            }
            iVar4 = (gen->stack).sp;
            ppDVar2[iVar4] = pDVar10;
            uVar6 = iVar4 + 1;
            uVar7 = (ulong)uVar6;
            (gen->stack).sp = uVar6;
          }
          if ((pDVar5 != (DdNode *)((ulong)pDVar1->one ^ 1)) && (pDVar5 != pDVar1->background)) {
            gen->status = 1;
            (gen->gen).cubes.value = (pDVar5->type).value;
            *cube = (gen->gen).cubes.cube;
            *value = (gen->gen).cubes.value;
            return 1;
          }
          while( true ) {
            if ((int)uVar7 == 1) goto LAB_00816218;
            pDVar10 = (DdNode *)((ulong)ppDVar2[(long)(int)uVar7 + -2] & 0xfffffffffffffffe);
            pDVar9 = (pDVar10->type).kids.T;
            pDVar8 = (DdNode *)((ulong)pDVar9 ^ 1);
            if (ppDVar2[(long)(int)uVar7 + -2] == pDVar10) {
              pDVar8 = pDVar9;
            }
            piVar3 = (gen->gen).cubes.cube;
            if (pDVar8 != pDVar5) break;
            piVar3[pDVar10->index] = 2;
            iVar4 = (gen->stack).sp;
            uVar6 = iVar4 - 1;
            uVar7 = (ulong)uVar6;
            (gen->stack).sp = uVar6;
            pDVar5 = ppDVar2[(long)iVar4 + -2];
          }
          piVar3[pDVar10->index] = 1;
          uVar7 = (ulong)(gen->stack).sp;
          ppDVar2[uVar7 - 1] = pDVar8;
        } while( true );
      }
      piVar3[pDVar8->index] = 2;
      iVar4 = (gen->stack).sp + -1;
      (gen->stack).sp = iVar4;
    } while (iVar4 != 1);
  }
LAB_00816218:
  gen->status = 0;
  (gen->stack).sp = 0;
  return 0;
}

Assistant:

int
Cudd_NextCube(
  DdGen * gen,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    DdManager *dd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        prev = gen->stack.stack[gen->stack.sp-2];
        preg = Cudd_Regular(prev);
        nreg = cuddT(preg);
        if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[preg->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[preg->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(1);

}